

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O3

void ImGui::TableSetupDrawChannels(ImGuiTable *table)

{
  ImGuiTableColumn *pIVar1;
  ImVec2 IVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImGuiTableDrawChannelIdx IVar5;
  ImGuiTableDrawChannelIdx IVar6;
  long lVar7;
  int iVar8;
  ImGuiTableDrawChannelIdx IVar9;
  char cVar10;
  int iVar11;
  bool bVar12;
  
  iVar11 = 1;
  if ((table->Flags & 0x100000) == 0) {
    iVar11 = (int)table->ColumnsEnabledCount;
  }
  bVar12 = true;
  if (table->ColumnsCount <= (int)table->ColumnsEnabledCount) {
    bVar12 = table->VisibleMaskByIndex != table->EnabledMaskByIndex;
  }
  iVar8 = ('\0' < table->FreezeRowsCount | 2) + (uint)bVar12 +
          (iVar11 << ('\0' < table->FreezeRowsCount));
  ImDrawListSplitter::Split(&table->DrawSplitter,table->InnerWindow->DrawList,iVar8);
  IVar5 = 0xff;
  if (bVar12 != false) {
    IVar5 = (char)iVar8 + 0xff;
  }
  table->DummyDrawChannel = IVar5;
  table->Bg2DrawChannelCurrent = '\x01';
  IVar6 = (char)iVar11 + '\x02';
  if (table->FreezeRowsCount < '\x01') {
    IVar6 = '\x01';
  }
  table->Bg2DrawChannelUnfrozen = IVar6;
  iVar8 = table->ColumnsCount;
  if (0 < (long)iVar8) {
    pIVar1 = (table->Columns).Data;
    lVar7 = 0;
    cVar10 = (char)iVar11 + '\x01';
    if (table->FreezeRowsCount < '\x01') {
      cVar10 = '\0';
    }
    IVar6 = '\x02';
    do {
      if (((&pIVar1->IsVisibleX)[lVar7] == true) && ((&pIVar1->IsVisibleY)[lVar7] == true)) {
        (&pIVar1->DrawChannelFrozen)[lVar7] = IVar6;
        (&pIVar1->DrawChannelUnfrozen)[lVar7] = IVar6 + cVar10;
        IVar9 = IVar6;
        IVar6 = IVar6 + ((table->Flags & 0x100000) == 0);
      }
      else {
        (&pIVar1->DrawChannelUnfrozen)[lVar7] = IVar5;
        (&pIVar1->DrawChannelFrozen)[lVar7] = IVar5;
        IVar9 = IVar5;
      }
      (&pIVar1->DrawChannelCurrent)[lVar7] = IVar9;
      lVar7 = lVar7 + 0x68;
    } while ((long)iVar8 * 0x68 - lVar7 != 0);
  }
  IVar2 = (table->InnerClipRect).Max;
  IVar3 = (table->HostClipRect).Min;
  IVar4 = (table->HostClipRect).Max;
  (table->BgClipRect).Min = (table->InnerClipRect).Min;
  (table->BgClipRect).Max = IVar2;
  IVar2 = (table->OuterWindow->ClipRect).Max;
  (table->Bg0ClipRectForDrawCmd).Min = (table->OuterWindow->ClipRect).Min;
  (table->Bg0ClipRectForDrawCmd).Max = IVar2;
  (table->Bg2ClipRectForDrawCmd).Min = IVar3;
  (table->Bg2ClipRectForDrawCmd).Max = IVar4;
  return;
}

Assistant:

void ImGui::TableSetupDrawChannels(ImGuiTable* table)
{
    const int freeze_row_multiplier = (table->FreezeRowsCount > 0) ? 2 : 1;
    const int channels_for_row = (table->Flags & ImGuiTableFlags_NoClip) ? 1 : table->ColumnsEnabledCount;
    const int channels_for_bg = 1 + 1 * freeze_row_multiplier;
    const int channels_for_dummy = (table->ColumnsEnabledCount < table->ColumnsCount || table->VisibleMaskByIndex != table->EnabledMaskByIndex) ? +1 : 0;
    const int channels_total = channels_for_bg + (channels_for_row * freeze_row_multiplier) + channels_for_dummy;
    table->DrawSplitter.Split(table->InnerWindow->DrawList, channels_total);
    table->DummyDrawChannel = (ImGuiTableDrawChannelIdx)((channels_for_dummy > 0) ? channels_total - 1 : -1);
    table->Bg2DrawChannelCurrent = TABLE_DRAW_CHANNEL_BG2_FROZEN;
    table->Bg2DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)((table->FreezeRowsCount > 0) ? 2 + channels_for_row : TABLE_DRAW_CHANNEL_BG2_FROZEN);

    int draw_channel_current = 2;
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        ImGuiTableColumn* column = &table->Columns[column_n];
        if (column->IsVisibleX && column->IsVisibleY)
        {
            column->DrawChannelFrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current);
            column->DrawChannelUnfrozen = (ImGuiTableDrawChannelIdx)(draw_channel_current + (table->FreezeRowsCount > 0 ? channels_for_row + 1 : 0));
            if (!(table->Flags & ImGuiTableFlags_NoClip))
                draw_channel_current++;
        }
        else
        {
            column->DrawChannelFrozen = column->DrawChannelUnfrozen = table->DummyDrawChannel;
        }
        column->DrawChannelCurrent = column->DrawChannelFrozen;
    }

    // Initial draw cmd starts with a BgClipRect that matches the one of its host, to facilitate merge draw commands by default.
    // All our cell highlight are manually clipped with BgClipRect. When unfreezing it will be made smaller to fit scrolling rect.
    // (This technically isn't part of setting up draw channels, but is reasonably related to be done here)
    table->BgClipRect = table->InnerClipRect;
    table->Bg0ClipRectForDrawCmd = table->OuterWindow->ClipRect;
    table->Bg2ClipRectForDrawCmd = table->HostClipRect;
    IM_ASSERT(table->BgClipRect.Min.y <= table->BgClipRect.Max.y);
}